

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocator.cpp
# Opt level: O1

void __thiscall xscript::parser::register_allocator::release(register_allocator *this,int32_t r)

{
  int32_t *piVar1;
  int32_t local_c [2];
  int32_t r_local;
  
  piVar1 = (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    local_c[0] = r;
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)this,local_c);
  }
  else {
    *piVar1 = r;
    (this->regs).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar1 + 1;
  }
  return;
}

Assistant:

void register_allocator::release(int32_t r) {
    regs.push(r);
}